

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

int __thiscall V2Reverb::init(V2Reverb *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  V2Instance *instance_local;
  V2Reverb *this_local;
  
  V2Delay::init<1309u>((V2Delay *)&this->field_0x28,&this->bcombl0);
  V2Delay::init<1635u>((V2Delay *)&this->field_0x38,&this->bcombl1);
  V2Delay::init<1811u>((V2Delay *)&this->field_0x48,&this->bcombl2);
  V2Delay::init<1926u>((V2Delay *)&this->field_0x58,&this->bcombl3);
  V2Delay::init<220u>((V2Delay *)&this->field_0xc8,&this->balll0);
  V2Delay::init<74u>((V2Delay *)&this->field_0xd8,&this->balll1);
  V2Delay::init<1327u>((V2Delay *)&this->field_0x68,&this->bcombr0);
  V2Delay::init<1631u>((V2Delay *)&this->field_0x78,&this->bcombr1);
  V2Delay::init<1833u>((V2Delay *)&this->field_0x88,&this->bcombr2);
  V2Delay::init<1901u>((V2Delay *)&this->field_0x98,&this->bcombr3);
  V2Delay::init<205u>((V2Delay *)&this->field_0xe8,&this->ballr0);
  V2Delay::init<77u>((V2Delay *)&this->field_0xf8,&this->ballr1);
  this->inst = (V2Instance *)ctx;
  reset(this);
  return extraout_EAX;
}

Assistant:

void init(V2Instance *instance)
    {
        // init filters
        combd[0][0].init(bcombl0);
        combd[0][1].init(bcombl1);
        combd[0][2].init(bcombl2);
        combd[0][3].init(bcombl3);
        alld[0][0].init(balll0);
        alld[0][1].init(balll1);
        combd[1][0].init(bcombr0);
        combd[1][1].init(bcombr1);
        combd[1][2].init(bcombr2);
        combd[1][3].init(bcombr3);
        alld[1][0].init(ballr0);
        alld[1][1].init(ballr1);

        inst = instance;
        reset();
    }